

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void MeCab::remove_pathname(string *s)

{
  string *psVar1;
  char *pcVar2;
  string *in_RDI;
  bool ok;
  int len;
  string local_30 [35];
  byte local_d;
  int local_c;
  string *local_8;
  
  local_8 = in_RDI;
  local_c = std::__cxx11::string::size();
  local_d = 0;
  do {
    local_c = local_c + -1;
    if (local_c < 0) goto LAB_0013cdc3;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_8);
  } while (*pcVar2 != '/');
  local_d = 1;
LAB_0013cdc3:
  psVar1 = local_8;
  if ((local_d & 1) == 0) {
    std::__cxx11::string::operator=(local_8,".");
  }
  else {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_30,(ulong)psVar1);
    std::__cxx11::string::operator=(local_8,local_30);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void remove_pathname(std::string *s) {
  int len = static_cast<int>(s->size()) - 1;
  bool ok = false;
  for (; len >= 0; --len) {
#if defined(_WIN32) && !defined(__CYGWIN__)
    if ((*s)[len] == '\\') {
      ok = true;
      break;
    }
#else
    if ((*s)[len] == '/')  {
      ok = true;
      break;
    }
#endif
  }
  if (ok)
    *s = s->substr(len + 1, s->size() - len);
  else
    *s = ".";
}